

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1acccd7::Scenario::DisconnectedPeer(Scenario *this,NodeId peer)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  undefined8 *puVar2;
  _Manager_type *pp_Var3;
  long lVar4;
  Runner *pRVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar9;
  pointer ppVar10;
  long lVar11;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar5 = this->m_runner;
  ppVar6 = (pRVar5->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 == (pRVar5->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = &pRVar5->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(this_00,1,"vector::_M_realloc_insert");
    ppVar7 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (pRVar5->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = (long)ppVar6 - (long)ppVar7 >> 3;
    if (__n == 0) {
      ppVar9 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)0x0;
    }
    else {
      ppVar9 = __gnu_cxx::
               new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
               ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)this_00,__n,(void *)0x0);
    }
    (&ppVar9->first)[lVar11].__r = (this->m_now).__r;
    puVar2 = (undefined8 *)((long)&(ppVar9->second).super__Function_base._M_functor + lVar11 * 8);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &(ppVar9->second).super__Function_base._M_manager + lVar11;
    *pp_Var3 = (_Manager_type)0x0;
    pp_Var3[1] = (_Manager_type)0x0;
    *(Runner **)((long)&(ppVar9->second).super__Function_base._M_functor + lVar11 * 8) = pRVar5;
    *(NodeId *)((long)&(ppVar9->second).super__Function_base._M_functor + lVar11 * 8 + 8) = peer;
    (&(ppVar9->second)._M_invoker)[lVar11] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    (&(ppVar9->second).super__Function_base._M_manager)[lVar11] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    ppVar10 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar7,ppVar6,ppVar9,this_00);
    ppVar10 = _GLOBAL__N_1::std::
              vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ::_S_do_relocate(ppVar6,ppVar8,ppVar10 + 1,this_00);
    if (ppVar7 != (pointer)0x0) {
      operator_delete(ppVar7,(long)(pRVar5->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar7
                     );
    }
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar9;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
    (pRVar5->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar9 + __n;
  }
  else {
    (ppVar6->first).__r = (this->m_now).__r;
    *(undefined8 *)&(ppVar6->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar6->second).super__Function_base._M_functor + 8) = 0;
    (ppVar6->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar6->second)._M_invoker = (_Invoker_type)0x0;
    *(Runner **)&(ppVar6->second).super__Function_base._M_functor = pRVar5;
    *(NodeId *)((long)&(ppVar6->second).super__Function_base._M_functor + 8) = peer;
    (ppVar6->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    (ppVar6->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    pppVar1 = &(pRVar5->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DisconnectedPeer(NodeId peer)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.DisconnectedPeer(peer);
            runner.txrequest.SanityCheck();
        });
    }